

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_pretransfer(Curl_easy *data)

{
  undefined1 *puVar1;
  unsigned_long *puVar2;
  uchar uVar3;
  uint uVar4;
  unsigned_long uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  CURLUcode CVar9;
  CURLcode CVar10;
  size_t sVar11;
  char *pcVar12;
  
  pcVar12 = (data->state).url;
  if (pcVar12 == (char *)0x0) {
    if ((data->set).uh == (CURLU *)0x0) goto LAB_005a95ad;
    uVar8 = *(uint *)&(data->state).field_0x6d0;
    if ((uVar8 >> 0x11 & 1) != 0) goto LAB_005a9550;
LAB_005a9575:
    if ((data->set).uh != (CURLU *)0x0) {
      (*Curl_cfree)((data->set).str[0x19]);
      CVar9 = curl_url_get((data->set).uh,CURLUPART_URL,(data->set).str + 0x19,0);
      if (CVar9 != CURLUE_OK) {
LAB_005a95ad:
        Curl_failf(data,"No URL set");
        return CURLE_URL_MALFORMAT;
      }
      uVar8 = *(uint *)&(data->state).field_0x6d0;
    }
  }
  else {
    uVar8 = *(uint *)&(data->state).field_0x6d0;
    if ((uVar8 >> 0x11 & 1) != 0) {
LAB_005a9550:
      (*Curl_cfree)(pcVar12);
      (data->state).url = (char *)0x0;
      uVar8 = *(uint *)&(data->state).field_0x6d0 & 0xfffdffff;
      *(uint *)&(data->state).field_0x6d0 = uVar8;
      goto LAB_005a9575;
    }
  }
  uVar4 = *(uint *)&(data->set).field_0x8e2;
  *(uint *)&(data->state).field_0x6d0 =
       (uVar4 & 0x200) << 7 | uVar8 & 0xfffe7fff | (uVar4 & 0x80) << 8;
  (data->state).httpreq = (data->set).method;
  (data->state).url = (data->set).str[0x19];
  CVar10 = Curl_ssl_initsessions(data,(data->set).general_ssl.max_ssl_sessions);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  (data->state).requests = 0;
  (data->state).followlocation = 0;
  (data->state).httpwant = (data->set).httpwant;
  (data->state).httpversion = '\0';
  puVar1 = &(data->state).field_0x6d0;
  *puVar1 = *puVar1 & 0xd5;
  uVar5 = (data->set).proxyauth;
  (data->state).authhost.want = (data->set).httpauth;
  (data->state).authproxy.want = uVar5;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  uVar3 = (data->state).httpreq;
  if ((uVar3 == '\0') || (uVar3 == '\x05')) {
    (data->state).infilesize = 0;
  }
  else {
    if (uVar3 == '\x04') {
      sVar11 = (data->set).filesize;
    }
    else {
      pcVar12 = (char *)(data->set).postfields;
      lVar6 = (data->set).postfieldsize;
      (data->state).infilesize = lVar6;
      if (lVar6 != -1 || pcVar12 == (char *)0x0) goto LAB_005a96e8;
      sVar11 = strlen(pcVar12);
    }
    (data->state).infilesize = sVar11;
  }
LAB_005a96e8:
  if ((data->state).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  if (((data->state).resolve == (curl_slist *)0x0) ||
     (CVar10 = Curl_loadhostpairs(data), CVar10 == CURLE_OK)) {
    puVar1 = &(data->state).field_0x6d0;
    *puVar1 = *puVar1 | 0x10;
    Curl_initinfo(data);
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);
    puVar2 = &(data->state).authhost.picked;
    *puVar2 = *puVar2 & (data->state).authhost.want;
    puVar2 = &(data->state).authproxy.picked;
    *puVar2 = *puVar2 & (data->state).authproxy.want;
    uVar7 = *(ulong *)&(data->set).field_0x8e2;
    *(uint *)&(data->state).field_0x6d0 =
         *(uint *)&(data->state).field_0x6d0 & 0xffffffbf | (uint)(uVar7 >> 9) & 0x40;
    if (((short)uVar7 < 0) &&
       (((data->wildcard).state == CURLWC_CLEAR &&
        (CVar10 = Curl_wildcard_init(&data->wildcard), CVar10 != CURLE_OK)))) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_http2_init_state(&data->state);
    CVar10 = CURLE_OK;
  }
  if ((data->set).str[0x24] != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
    pcVar12 = curl_maprintf("User-Agent: %s\r\n",(data->set).str[0x24]);
    (data->state).aptr.uagent = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((((CVar10 == CURLE_OK) &&
       (CVar10 = Curl_setstropt(&(data->state).aptr.user,(data->set).str[0x2a]), CVar10 == CURLE_OK)
       ) && (CVar10 = Curl_setstropt(&(data->state).aptr.passwd,(data->set).str[0x2b]),
            CVar10 == CURLE_OK)) &&
     (CVar10 = Curl_setstropt(&(data->state).aptr.proxyuser,(data->set).str[0x2d]),
     CVar10 == CURLE_OK)) {
    CVar10 = Curl_setstropt(&(data->state).aptr.proxypasswd,(data->set).str[0x2e]);
  }
  (data->req).headerbytecount = 0;
  Curl_headers_cleanup(data);
  return CVar10;
}

Assistant:

CURLcode Curl_pretransfer(struct Curl_easy *data)
{
  CURLcode result;

  if(!data->state.url && !data->set.uh) {
    /* we can't do anything without URL */
    failf(data, "No URL set");
    return CURLE_URL_MALFORMAT;
  }

  /* since the URL may have been redirected in a previous use of this handle */
  if(data->state.url_alloc) {
    /* the already set URL is allocated, free it first! */
    Curl_safefree(data->state.url);
    data->state.url_alloc = FALSE;
  }

  if(!data->state.url && data->set.uh) {
    CURLUcode uc;
    free(data->set.str[STRING_SET_URL]);
    uc = curl_url_get(data->set.uh,
                      CURLUPART_URL, &data->set.str[STRING_SET_URL], 0);
    if(uc) {
      failf(data, "No URL set");
      return CURLE_URL_MALFORMAT;
    }
  }

  data->state.prefer_ascii = data->set.prefer_ascii;
  data->state.list_only = data->set.list_only;
  data->state.httpreq = data->set.method;
  data->state.url = data->set.str[STRING_SET_URL];

  /* Init the SSL session ID cache here. We do it here since we want to do it
     after the *_setopt() calls (that could specify the size of the cache) but
     before any transfer takes place. */
  result = Curl_ssl_initsessions(data, data->set.general_ssl.max_ssl_sessions);
  if(result)
    return result;

  data->state.requests = 0;
  data->state.followlocation = 0; /* reset the location-follow counter */
  data->state.this_is_a_follow = FALSE; /* reset this */
  data->state.errorbuf = FALSE; /* no error has occurred */
  data->state.httpwant = data->set.httpwant;
  data->state.httpversion = 0;
  data->state.authproblem = FALSE;
  data->state.authhost.want = data->set.httpauth;
  data->state.authproxy.want = data->set.proxyauth;
  Curl_safefree(data->info.wouldredirect);

  if(data->state.httpreq == HTTPREQ_PUT)
    data->state.infilesize = data->set.filesize;
  else if((data->state.httpreq != HTTPREQ_GET) &&
          (data->state.httpreq != HTTPREQ_HEAD)) {
    data->state.infilesize = data->set.postfieldsize;
    if(data->set.postfields && (data->state.infilesize == -1))
      data->state.infilesize = (curl_off_t)strlen(data->set.postfields);
  }
  else
    data->state.infilesize = 0;

#ifndef CURL_DISABLE_COOKIES
  /* If there is a list of cookie files to read, do it now! */
  if(data->state.cookielist)
    Curl_cookie_loadfiles(data);
#endif
  /* If there is a list of host pairs to deal with */
  if(data->state.resolve)
    result = Curl_loadhostpairs(data);

  if(!result) {
    /* Allow data->set.use_port to set which port to use. This needs to be
     * disabled for example when we follow Location: headers to URLs using
     * different ports! */
    data->state.allow_port = TRUE;

#if defined(HAVE_SIGNAL) && defined(SIGPIPE) && !defined(HAVE_MSG_NOSIGNAL)
    /*************************************************************
     * Tell signal handler to ignore SIGPIPE
     *************************************************************/
    if(!data->set.no_signal)
      data->state.prev_signal = signal(SIGPIPE, SIG_IGN);
#endif

    Curl_initinfo(data); /* reset session-specific information "variables" */
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);

    /* In case the handle is re-used and an authentication method was picked
       in the session we need to make sure we only use the one(s) we now
       consider to be fine */
    data->state.authhost.picked &= data->state.authhost.want;
    data->state.authproxy.picked &= data->state.authproxy.want;

#ifndef CURL_DISABLE_FTP
    data->state.wildcardmatch = data->set.wildcard_enabled;
    if(data->state.wildcardmatch) {
      struct WildcardData *wc = &data->wildcard;
      if(wc->state < CURLWC_INIT) {
        result = Curl_wildcard_init(wc); /* init wildcard structures */
        if(result)
          return CURLE_OUT_OF_MEMORY;
      }
    }
#endif
    Curl_http2_init_state(&data->state);
    result = Curl_hsts_loadcb(data, data->hsts);
  }

  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through a http proxy we can't limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(data->state.aptr.uagent);
    data->state.aptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!data->state.aptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!result)
    result = Curl_setstropt(&data->state.aptr.user,
                            data->set.str[STRING_USERNAME]);
  if(!result)
    result = Curl_setstropt(&data->state.aptr.passwd,
                            data->set.str[STRING_PASSWORD]);
  if(!result)
    result = Curl_setstropt(&data->state.aptr.proxyuser,
                            data->set.str[STRING_PROXYUSERNAME]);
  if(!result)
    result = Curl_setstropt(&data->state.aptr.proxypasswd,
                            data->set.str[STRING_PROXYPASSWORD]);

  data->req.headerbytecount = 0;
  Curl_headers_cleanup(data);
  return result;
}